

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeleteMessage.cpp
# Opt level: O3

string * __thiscall
DeleteMessage::execute_abi_cxx11_(string *__return_storage_ptr__,DeleteMessage *this)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  long lVar4;
  char *pcVar5;
  int iVar6;
  long *plVar7;
  DIR *__dirp;
  dirent *pdVar8;
  size_t sVar9;
  undefined8 *puVar10;
  size_type *psVar11;
  long *plVar12;
  int iVar13;
  string *psVar14;
  string dir;
  allocator local_b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string *local_90;
  string *local_88;
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  undefined1 *local_60 [2];
  undefined1 local_50 [16];
  char *local_40;
  char *local_38;
  
  std::__cxx11::string::string
            ((string *)local_60,(this->super_ServerOperation).MESSAGEDIR,&local_b1);
  plVar7 = (long *)std::__cxx11::string::append((char *)local_60);
  psVar11 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_b0.field_2._M_allocated_capacity = *psVar11;
    local_b0.field_2._8_8_ = plVar7[3];
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  }
  else {
    local_b0.field_2._M_allocated_capacity = *psVar11;
    local_b0._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_b0._M_string_length = plVar7[1];
  *plVar7 = (long)psVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_b0,(ulong)(this->username)._M_dataplus._M_p);
  local_80 = &local_70;
  plVar12 = plVar7 + 2;
  if ((long *)*plVar7 == plVar12) {
    local_70 = *plVar12;
    lStack_68 = plVar7[3];
  }
  else {
    local_70 = *plVar12;
    local_80 = (long *)*plVar7;
  }
  local_78 = plVar7[1];
  *plVar7 = (long)plVar12;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if (local_60[0] != local_50) {
    operator_delete(local_60[0]);
  }
  local_88 = __return_storage_ptr__;
  __dirp = opendir((char *)local_80);
  if (__dirp == (DIR *)0x0) {
    pcVar2 = (this->super_ServerOperation).FAILURE;
    pcVar3 = (char *)(this->super_ServerOperation).statusMessage._M_string_length;
    strlen(pcVar2);
    std::__cxx11::string::_M_replace
              ((ulong)&(this->super_ServerOperation).statusMessage,0,pcVar3,(ulong)pcVar2);
    closedir((DIR *)0x0);
    std::operator+(&local_b0,"No such User \"",&this->username);
    psVar14 = local_88;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_b0);
    (psVar14->_M_dataplus)._M_p = (pointer)&psVar14->field_2;
    psVar11 = (size_type *)(plVar7 + 2);
    if ((size_type *)*plVar7 == psVar11) {
      lVar4 = plVar7[3];
      (psVar14->field_2)._M_allocated_capacity = *psVar11;
      *(long *)((long)&psVar14->field_2 + 8) = lVar4;
    }
    else {
      (psVar14->_M_dataplus)._M_p = (pointer)*plVar7;
      (psVar14->field_2)._M_allocated_capacity = *psVar11;
    }
    psVar14->_M_string_length = plVar7[1];
    *plVar7 = (long)psVar11;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
  }
  else {
    local_38 = (this->super_ServerOperation).FAILURE;
    local_90 = &(this->super_ServerOperation).statusMessage;
    local_40 = (this->super_ServerOperation).SUCCESS;
    iVar6 = 1;
    iVar13 = 0;
    while ((pdVar8 = readdir(__dirp), psVar14 = local_88, pdVar8 != (dirent *)0x0 &&
           (iVar1 = this->chosen_message, iVar13 <= iVar1))) {
      if ((pdVar8->d_type == '\b') && (iVar13 = iVar13 + 1, iVar13 == iVar1)) {
        local_60[0] = local_50;
        sVar9 = strlen(pdVar8->d_name);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_60,pdVar8->d_name,pdVar8->d_name + sVar9);
        puVar10 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)local_60,0,(char *)0x0,0x107270);
        psVar11 = puVar10 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_b0.field_2._M_allocated_capacity = *psVar11;
          local_b0.field_2._8_8_ = puVar10[3];
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        }
        else {
          local_b0.field_2._M_allocated_capacity = *psVar11;
          local_b0._M_dataplus._M_p = (pointer)*puVar10;
        }
        local_b0._M_string_length = puVar10[1];
        *puVar10 = psVar11;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_80,(ulong)local_b0._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p);
        }
        if (local_60[0] != local_50) {
          operator_delete(local_60[0]);
        }
        iVar6 = remove((char *)local_80);
        pcVar5 = local_38;
        pcVar3 = local_40;
        pcVar2 = (char *)(this->super_ServerOperation).statusMessage._M_string_length;
        iVar13 = iVar1;
        if (iVar6 == 0) {
          strlen(local_40);
          iVar6 = 0;
          std::__cxx11::string::_M_replace((ulong)local_90,0,pcVar2,(ulong)pcVar3);
        }
        else {
          strlen(local_38);
          std::__cxx11::string::_M_replace((ulong)local_90,0,pcVar2,(ulong)pcVar5);
        }
      }
    }
    (local_88->_M_dataplus)._M_p = (pointer)&local_88->field_2;
    if (iVar6 == 0) {
      std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"Message deleted","");
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"Delete not successful","")
      ;
    }
  }
  if (local_80 != &local_70) {
    operator_delete(local_80);
  }
  return psVar14;
}

Assistant:

string DeleteMessage::execute() {
    int count = 0;
    int delete_result = 1;
    ///create and parse a path to the correct user directory
    string dir = string(MESSAGEDIR) + "/" + username;

    ///open the user directory with the input path
    DIR* userDir = opendir(dir.c_str()); //Open User Directory

    struct dirent * userDirEntry; //individual entries in the directory.

    ///if no directory found return 0
    if(userDir == nullptr){
        statusMessage = FAILURE;
        closedir(userDir);
        return "No such User \"" + username + "\" found\n";
    }

    ///while directory isn't empty or didn't reach right file keep looking:
    while ((userDirEntry = readdir(userDir)) != nullptr && count <= chosen_message) {
        ///check if the file is a regular type
        if (userDirEntry->d_type == DT_REG) {
            //count as countable file
            count++;
            if (count == chosen_message) {
                //deleting if reached correct file
                dir += "/" + string(userDirEntry->d_name);
                delete_result = remove(dir.c_str());
                ///check if remove function returned 0 for success or other code for failure
                if(delete_result == 0){
                    statusMessage = SUCCESS;
                }else{
                    statusMessage = FAILURE;
                }
            }
        }
    }

    ///return the correct string to give user the information about success or failure
    if(delete_result == 0){
        return "Message deleted";
    }else{
        return "Delete not successful";
    }
}